

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O2

void zmCreateMont(qr_o *r,octet *mod,size_t no,void *stack)

{
  u64 uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  r->n = no + 7 >> 3;
  r->no = no;
  r->mod = (word *)(r + 1);
  u64From((u64 *)(r + 1),mod,no);
  r->unity = r->mod + r->n;
  wwSetZero(r->mod + r->n,r->n);
  zzSub2(r->unity,r->mod,r->n);
  zzMod(r->unity,r->unity,r->n,r->mod,r->n,stack);
  r->params = r->unity + r->n;
  uVar1 = u64NegInv(*r->mod);
  *(u64 *)r->params = uVar1;
  r->from = zmFromMont;
  r->to = zmToMont;
  r->add = zmAdd2;
  r->sub = zmSub2;
  r->neg = zmNeg2;
  r->mul = zmMulMont;
  r->sqr = zmSqrMont;
  r->inv = zmInvMont;
  r->div = zmDivMont;
  sVar2 = zmFromMont_deep(r->n);
  sVar3 = zmToMont_deep(r->n);
  sVar4 = zmMulMont_deep(r->n);
  sVar5 = zmSqrMont_deep(r->n);
  sVar6 = zzAlmostInvMod_deep(r->n);
  sVar7 = zmDivMont_deep(r->n);
  sVar2 = utilMax(6,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7);
  r->deep = sVar2;
  (r->hdr).keep = r->n * 0x10 + 0x98;
  (r->hdr).p_count = 3;
  (r->hdr).o_count = 0;
  return;
}

Assistant:

void zmCreateMont(qr_o* r, const octet mod[], size_t no, void* stack)
{
	ASSERT(memIsValid(r, sizeof(qr_o)));
	ASSERT(memIsValid(mod, no));
	ASSERT(no > 0 && mod[no - 1] > 0);
	ASSERT(mod[0] % 2 != 0);
	// зафиксировать размерности
	r->n = W_OF_O(no);
	r->no = no;
	// зафиксировать модуль
	r->mod = (word*)r->descr;
	wwFrom(r->mod, mod, no);
	// подготовить единицу
	r->unity = r->mod + r->n;
	wwSetZero(r->unity, r->n);
	zzSub2(r->unity, r->mod, r->n);
	zzMod(r->unity, r->unity, r->n, r->mod, r->n, stack);
	// подготовить параметры
	r->params = r->unity + r->n;
	*((word*)r->params) = wordNegInv(r->mod[0]);
	// настроить функции
	r->from = zmFromMont;
	r->to = zmToMont;
	r->add = zmAdd2;
	r->sub = zmSub2;
	r->neg = zmNeg2;
	r->mul = zmMulMont;
	r->sqr = zmSqrMont;
	r->inv = zmInvMont;
	r->div = zmDivMont;
	r->deep = utilMax(6,
		zmFromMont_deep(r->n),
		zmToMont_deep(r->n),
		zmMulMont_deep(r->n),
		zmSqrMont_deep(r->n),
		zmInvMont_deep(r->n),
		zmDivMont_deep(r->n));
	// настроить заголовок
	r->hdr.keep = sizeof(qr_o) + O_OF_W(2 * r->n + 1);
	r->hdr.p_count = 3;
	r->hdr.o_count = 0;
}